

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cpp::EscapeTrigraphs
                   (string *__return_storage_ptr__,string *to_escape)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"?",&local_51);
  std::__cxx11::string::string((string *)&local_50,"\\?",&local_52);
  StringReplace(__return_storage_ptr__,to_escape,&local_30,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string EscapeTrigraphs(const string& to_escape) {
  return StringReplace(to_escape, "?", "\\?", true);
}